

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_unreachable
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_array_create(context,0);
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'\x02',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_unreachable(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 0);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_UNREACHABLE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}